

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O1

bool __thiscall
QSQLiteDriverPrivate::isIdentifierEscaped(QSQLiteDriverPrivate *this,QStringView identifier)

{
  storage_type *psVar1;
  long lVar2;
  bool bVar3;
  
  psVar1 = identifier.m_data;
  lVar2 = identifier.m_size;
  if (lVar2 < 3) {
    return false;
  }
  if (((*psVar1 != L'\"') || (bVar3 = true, psVar1[lVar2 + -1] != L'\"')) &&
     ((*psVar1 != L'`' || (bVar3 = true, psVar1[lVar2 + -1] != L'`')))) {
    if (*psVar1 != L'[') {
      return false;
    }
    bVar3 = psVar1[lVar2 + -1] == L']';
  }
  return bVar3;
}

Assistant:

bool QSQLiteDriverPrivate::isIdentifierEscaped(QStringView identifier) const
{
    return identifier.size() > 2
            && ((identifier.startsWith(u'"') && identifier.endsWith(u'"'))
                || (identifier.startsWith(u'`') && identifier.endsWith(u'`'))
                || (identifier.startsWith(u'[') && identifier.endsWith(u']')));
}